

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void __thiscall
SharedPtrTests_base_Constructor_Test::~SharedPtrTests_base_Constructor_Test
          (SharedPtrTests_base_Constructor_Test *this)

{
  SharedPtrTests_base_Constructor_Test *this_local;
  
  ~SharedPtrTests_base_Constructor_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(SharedPtrTests_base,Constructor) {
	int* a;
	a = new int;
	*a = 4;
	SharedPtr<int> testingPtr(a);
	EXPECT_EQ(testingPtr.use_count(),1);
	EXPECT_EQ(testingPtr.get(), a);
	EXPECT_TRUE(testingPtr);
}